

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR xpath_last(lyxp_set **UNUSED_args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  ly_ctx *ctx;
  char *pcVar1;
  LY_ERR LVar2;
  longdouble number;
  
  if ((options & 0x1c) == 0) {
    if (set->type == LYXP_SET_NODE_SET) {
      if (set->used == 0) {
        number = (longdouble)0;
      }
      else {
        number = (longdouble)set->ctx_size;
      }
      set_fill_number(set,number);
      LVar2 = LY_SUCCESS;
    }
    else {
      ctx = set->ctx;
      pcVar1 = print_set_type(set);
      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Invalid context type %s in %s.",pcVar1,"last()");
      LVar2 = LY_EVALID;
    }
  }
  else {
    LVar2 = LY_SUCCESS;
    set_scnode_clear_ctx(set,0);
  }
  return LVar2;
}

Assistant:

static LY_ERR
xpath_last(struct lyxp_set **UNUSED(args), uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    if (options & LYXP_SCNODE_ALL) {
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_NODE);
        return LY_SUCCESS;
    }

    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INCTX, print_set_type(set), "last()");
        return LY_EVALID;
    } else if (!set->used) {
        set_fill_number(set, 0);
        return LY_SUCCESS;
    }

    set_fill_number(set, set->ctx_size);
    return LY_SUCCESS;
}